

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardFileIterator.h
# Opt level: O0

void __thiscall
bwtil::BackwardFileIterator::BackwardFileIterator(BackwardFileIterator *this,string *path)

{
  char *__filename;
  FILE *pFVar1;
  ostream *poVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  string *in_RSI;
  BackwardIterator *in_RDI;
  __type _Var5;
  __type _Var6;
  undefined1 auVar7 [16];
  
  BackwardIterator::BackwardIterator(in_RDI);
  in_RDI->_vptr_BackwardIterator = (_func_int **)&PTR__BackwardFileIterator_00185c98;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::operator=((string *)(in_RDI + 4),in_RSI);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"rb");
  in_RDI[0xb]._vptr_BackwardIterator = (_func_int **)pFVar1;
  if (in_RDI[0xb]._vptr_BackwardIterator == (_func_int **)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error while opening file ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  fseek((FILE *)in_RDI[0xb]._vptr_BackwardIterator,0,2);
  pp_Var3 = (_func_int **)ftell((FILE *)in_RDI[0xb]._vptr_BackwardIterator);
  in_RDI[1]._vptr_BackwardIterator = pp_Var3;
  if (in_RDI[1]._vptr_BackwardIterator == (_func_int **)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: file ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," has length 0.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  pp_Var3 = in_RDI[1]._vptr_BackwardIterator;
  _Var5 = std::log2<unsigned_long>(0x149b05);
  _Var6 = std::log2<unsigned_long>(0x149b1c);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = _Var5 * _Var6;
  uVar4 = vcvttsd2usi_avx512f(auVar7);
  in_RDI[2]._vptr_BackwardIterator = (_func_int **)((ulong)pp_Var3 / uVar4);
  if (in_RDI[2]._vptr_BackwardIterator == (_func_int **)0x0) {
    in_RDI[2]._vptr_BackwardIterator = (_func_int **)0x1;
  }
  pp_Var3 = (_func_int **)operator_new__((ulong)in_RDI[2]._vptr_BackwardIterator);
  in_RDI[8]._vptr_BackwardIterator = pp_Var3;
  (*in_RDI->_vptr_BackwardIterator[2])();
  return;
}

Assistant:

BackwardFileIterator(string &path){

		this->path=path;

		fp = fopen(path.c_str(), "rb");

		if (fp == NULL){
		  cout << "Error while opening file " << path <<endl;
		  exit(0);
		}

		fseek(fp, 0, SEEK_END);
		n = ftell(fp);

		if (n == 0){
		  cout << "Error: file " << path << " has length 0." << endl;
		  exit(0);
		}

		bufferSize = n/(ulint)(log2(n+1)*log2(n+1));//read file in chunks of n/log^2 n bytes (in total log^2 n sequential reads of the file)
		if(bufferSize==0)
			bufferSize = 1;

		buffer = new symbol[bufferSize];

		/*cout << "bufferSize="<<bufferSize<<endl;
		cout << "txt len="<<n<<endl;*/

		rewind();

	}